

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O0

TPZSavable * __thiscall
TPZRestoreClass<TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>_>::Restore
          (TPZRestoreClass<TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>_> *this)

{
  long *plVar1;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_> *ptr;
  undefined8 local_30;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_> *in_stack_fffffffffffffff0;
  
  plVar1 = (long *)operator_new(200);
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>::TPZCompElPostProc
            (in_stack_fffffffffffffff0);
  local_30 = (TPZSavable *)0x0;
  if (plVar1 != (long *)0x0) {
    local_30 = (TPZSavable *)((long)plVar1 + *(long *)(*plVar1 + -0x60));
  }
  return local_30;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }